

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int trytypeattr(rnndb *db,char *file,xmlNode *node,xmlAttr *attr,rnntypeinfo *ti)

{
  int iVar1;
  uint64_t uVar2;
  void *pvVar3;
  char *pcVar4;
  xmlAttr *in_RCX;
  char *in_RDX;
  rnndb *in_RSI;
  rnndb *in_RDI;
  xmlAttr *in_R8;
  int local_4;
  
  iVar1 = strcmp((char *)in_RCX->name,"shr");
  if (iVar1 == 0) {
    uVar2 = getnumattrib(in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX);
    *(int *)&in_R8->ns = (int)uVar2;
    local_4 = 1;
  }
  else {
    iVar1 = strcmp((char *)in_RCX->name,"min");
    if (iVar1 == 0) {
      uVar2 = getnumattrib(in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX);
      *(uint64_t *)&in_R8->atype = uVar2;
      in_R8[1].type = XML_ELEMENT_NODE;
      local_4 = 1;
    }
    else {
      iVar1 = strcmp((char *)in_RCX->name,"max");
      if (iVar1 == 0) {
        pvVar3 = (void *)getnumattrib(in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX);
        in_R8->psvi = pvVar3;
        *(undefined4 *)&in_R8[1].field_0xc = 1;
        local_4 = 1;
      }
      else {
        iVar1 = strcmp((char *)in_RCX->name,"align");
        if (iVar1 == 0) {
          pvVar3 = (void *)getnumattrib(in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX);
          in_R8[1]._private = pvVar3;
          *(undefined4 *)&in_R8[1].name = 1;
          local_4 = 1;
        }
        else {
          iVar1 = strcmp((char *)in_RCX->name,"type");
          if (iVar1 == 0) {
            pcVar4 = getattrib(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),in_R8);
            pcVar4 = strdup(pcVar4);
            in_R8->_private = pcVar4;
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int trytypeattr (struct rnndb *db, char *file, xmlNode *node, xmlAttr *attr, struct rnntypeinfo *ti) {
	if (!strcmp(attr->name, "shr")) {
		ti->shr = getnumattrib(db, file, node->line, attr);
		return 1;
	} else if (!strcmp(attr->name, "min")) {
		ti->min = getnumattrib(db, file, node->line, attr);
		ti->minvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "max")) {
		ti->max = getnumattrib(db, file, node->line, attr);
		ti->maxvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "align")) {
		ti->align = getnumattrib(db, file, node->line, attr);
		ti->alignvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "type")) {
		ti->name = strdup(getattrib(db, file, node->line, attr));;
		return 1;
	}
	return 0;
}